

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void __thiscall zmq::mechanism_t::peer_routing_id(mechanism_t *this,msg_t *msg_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  void *__dest;
  uchar *__src;
  size_t __n;
  msg_t *in_RSI;
  long in_RDI;
  char *errstr;
  int rc;
  size_t in_stack_ffffffffffffffc0;
  msg_t *in_stack_ffffffffffffffc8;
  
  blob_t::size((blob_t *)(in_RDI + 0x560));
  iVar1 = msg_t::init_size(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/mechanism.cpp"
            ,0x3a);
    fflush(_stderr);
    zmq_abort((char *)0x314bf3);
  }
  __dest = msg_t::data(in_stack_ffffffffffffffc8);
  __src = blob_t::data((blob_t *)(in_RDI + 0x560));
  __n = blob_t::size((blob_t *)(in_RDI + 0x560));
  memcpy(__dest,__src,__n);
  msg_t::set_flags(in_RSI,'@');
  return;
}

Assistant:

void zmq::mechanism_t::peer_routing_id (msg_t *msg_)
{
    const int rc = msg_->init_size (_routing_id.size ());
    errno_assert (rc == 0);
    memcpy (msg_->data (), _routing_id.data (), _routing_id.size ());
    msg_->set_flags (msg_t::routing_id);
}